

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateLinkLibs
          (cmMakefileTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *linkLibs,
          bool useResponseFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,ResponseFlagFor responseMode)

{
  cmGeneratorTarget *this_00;
  cmComputeLinkInformation *pcli;
  long lVar1;
  char *__s;
  string_view source;
  cmAlphaNum local_170;
  string local_140;
  string link_rsp;
  string responseFlag;
  string linkPath;
  string frameworkPath;
  string responseFileName;
  cmAlphaNum local_80;
  string local_50;
  
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&local_170,this);
  pcli = cmGeneratorTarget::GetLinkInformation(this_00,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  cmLocalGenerator::OutputLinkLibraries
            ((cmLocalGenerator *)this->LocalGenerator,pcli,linkLineComputer,linkLibs,&frameworkPath,
             &linkPath);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                 &frameworkPath,&linkPath);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                 linkLibs);
  std::__cxx11::string::operator=((string *)linkLibs,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_80);
  if (useResponseFile) {
    lVar1 = std::__cxx11::string::find_first_not_of((char)linkLibs,0x20);
    if (lVar1 != -1) {
      GetResponseFlag_abi_cxx11_(&responseFlag,this,responseMode);
      __s = "deviceLinkLibs.rsp";
      if (responseMode == Link) {
        __s = "linkLibs.rsp";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&responseFileName,__s,(allocator<char> *)&local_170);
      CreateResponseFile(&link_rsp,this,&responseFileName,linkLibs,makefile_depends);
      local_170.View_._M_len = responseFlag._M_string_length;
      local_170.View_._M_str = responseFlag._M_dataplus._M_p;
      source._M_str = link_rsp._M_dataplus._M_p;
      source._M_len = link_rsp._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_140,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      local_80.View_._M_len = local_140._M_string_length;
      local_80.View_._M_str = local_140._M_dataplus._M_p;
      cmStrCat<>(&local_50,&local_170,&local_80);
      std::__cxx11::string::operator=((string *)linkLibs,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&link_rsp);
      std::__cxx11::string::~string((string *)&responseFileName);
      std::__cxx11::string::~string((string *)&responseFlag);
    }
  }
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkLibs(
  cmLinkLineComputer* linkLineComputer, std::string& linkLibs,
  bool useResponseFile, std::vector<std::string>& makefile_depends,
  ResponseFlagFor responseMode)
{
  std::string frameworkPath;
  std::string linkPath;
  cmComputeLinkInformation* pcli =
    this->GeneratorTarget->GetLinkInformation(this->GetConfigName());
  this->LocalGenerator->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                            frameworkPath, linkPath);
  linkLibs = frameworkPath + linkPath + linkLibs;

  if (useResponseFile &&
      linkLibs.find_first_not_of(' ') != std::string::npos) {
    // Lookup the response file reference flag.
    std::string responseFlag = this->GetResponseFlag(responseMode);

    // Create this response file.
    std::string responseFileName =
      (responseMode == Link) ? "linkLibs.rsp" : "deviceLinkLibs.rsp";
    std::string link_rsp =
      this->CreateResponseFile(responseFileName, linkLibs, makefile_depends);

    // Reference the response file.
    linkLibs = cmStrCat(responseFlag,
                        this->LocalGenerator->ConvertToOutputFormat(
                          link_rsp, cmOutputConverter::SHELL));
  }
}